

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O0

QRect __thiscall QListViewPrivate::cellRectForIndex(QListViewPrivate *this,QModelIndex *index)

{
  bool bVar1;
  QListViewPrivate *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QRect QVar2;
  Alignment oldItemAlignment;
  QRect rect;
  QAbstractItemViewPrivate *in_stack_ffffffffffffffc0;
  int local_20;
  int local_1c;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = hasRectForIndex(in_RSI,in_RDI);
  if (bVar1) {
    QAbstractItemViewPrivate::executePostedLayout(in_stack_ffffffffffffffc0);
    local_1c = in_RDI[0x3d].r;
    memset(&local_20,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x88b465);
    in_RDI[0x3d].r = local_20;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = (undefined1  [16])rectForIndex(in_RSI,in_RDI);
    in_RDI[0x3d].r = local_1c;
  }
  else {
    QRect::QRect((QRect *)in_stack_ffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar2.x1.m_i = local_18._0_4_;
    QVar2.y1.m_i = local_18._4_4_;
    QVar2.x2.m_i = local_18._8_4_;
    QVar2.y2.m_i = local_18._12_4_;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect cellRectForIndex(const QModelIndex &index)
    {
        if (!hasRectForIndex(index))
            return QRect();
        executePostedLayout();
        auto oldItemAlignment = itemAlignment;
        itemAlignment = Qt::Alignment();
        const QRect rect = rectForIndex(index);
        itemAlignment = oldItemAlignment;
        return rect;
    }